

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O3

vector<point,_std::allocator<point>_> *
filter_points(vector<point,_std::allocator<point>_> *__return_storage_ptr__,
             vector<point,_std::allocator<point>_> *input)

{
  pointer *pppVar1;
  pointer ppVar2;
  iterator __position;
  float fVar3;
  float fVar4;
  float fVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  ostream *poVar9;
  vector<point,_std::allocator<point>_> *__range1;
  point *point;
  pointer this;
  undefined1 auVar10 [16];
  
  (__return_storage_ptr__->super__Vector_base<point,_std::allocator<point>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<point,_std::allocator<point>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<point,_std::allocator<point>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppVar2 = (input->super__Vector_base<point,_std::allocator<point>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (this = (input->super__Vector_base<point,_std::allocator<point>_>)._M_impl.
              super__Vector_impl_data._M_start; this != ppVar2; this = this + 1) {
    ::point::angle(this);
    ::point::angle(this);
    bVar6 = point_allowed(this);
    if (bVar6) {
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<point,_std::allocator<point>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<point,_std::allocator<point>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<point,std::allocator<point>>::_M_realloc_insert<point_const&>
                  ((vector<point,std::allocator<point>> *)__return_storage_ptr__,__position,this);
      }
      else {
        fVar3 = this->y;
        fVar4 = this->z;
        fVar5 = this->i;
        (__position._M_current)->x = this->x;
        (__position._M_current)->y = fVar3;
        (__position._M_current)->z = fVar4;
        (__position._M_current)->i = fVar5;
        pppVar1 = &(__return_storage_ptr__->super__Vector_base<point,_std::allocator<point>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *pppVar1 = *pppVar1 + 1;
      }
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Kept ",5);
  lVar7 = (long)(__return_storage_ptr__->super__Vector_base<point,_std::allocator<point>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(__return_storage_ptr__->super__Vector_base<point,_std::allocator<point>_>)._M_impl.
                super__Vector_impl_data._M_start;
  lVar8 = lVar7 >> 4;
  auVar10._8_4_ = (int)(lVar7 >> 0x24);
  auVar10._0_8_ = lVar8;
  auVar10._12_4_ = 0x45300000;
  poVar9 = std::ostream::_M_insert<double>
                     ((((auVar10._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)) * 100.0) /
                      (double)(ulong)((long)(input->
                                            super__Vector_base<point,_std::allocator<point>_>).
                                            _M_impl.super__Vector_impl_data._M_finish -
                                      (long)(input->
                                            super__Vector_base<point,_std::allocator<point>_>).
                                            _M_impl.super__Vector_impl_data._M_start >> 4));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  return __return_storage_ptr__;
}

Assistant:

std::vector<point> filter_points(vector<point> &input) {
    vector<point> output;
    float min_angle = 0;
    float max_angle = 0;

    for(auto &point: input) {
        min_angle = min(min_angle, point.angle());
        max_angle = max(max_angle, point.angle());
        if(point_allowed(point)) {
            output.push_back(point);
        }
    }

    //cout << "Min angle is " << min_angle << endl;
    //cout << "Max angle is " << max_angle << endl;
    cout << "Kept " << (100.0 * output.size() / (float) input.size()) << endl;

    return output;
}